

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

precise_unit units::checkMultiplierCharacter(string *unit_string,uint64_t match_flags,char mchar)

{
  char cVar1;
  precise_unit pVar2;
  bool bVar3;
  ulong uVar4;
  long lVar5;
  undefined7 in_register_00000011;
  precise_unit pVar6;
  string ustring;
  string local_70;
  string local_50;
  
  ustring._M_dataplus._M_p = (pointer)&ustring.field_2;
  ustring._M_string_length = 0;
  ustring.field_2._M_local_buf[0] = '\0';
  uVar4 = std::__cxx11::string::find
                    ((char)unit_string,CONCAT71(in_register_00000011,mchar) & 0xffffffff);
  pVar2.base_units_ = (unit_data)0xfa94a488;
  pVar2.commodity_ = 0;
  pVar2.multiplier_ = NAN;
  if (uVar4 == 0xffffffffffffffff) goto LAB_00158363;
  lVar5 = std::__cxx11::string::find((char)unit_string,(ulong)(uint)(int)mchar);
  if (lVar5 == -1) {
    std::__cxx11::string::_M_assign((string *)&ustring);
    std::__cxx11::string::erase((ulong)&ustring,uVar4);
    std::__cxx11::string::string((string *)&local_50,(string *)&ustring);
    pVar6 = unit_quick_match(&local_50,match_flags);
    std::__cxx11::string::~string((string *)&local_50);
    if ((pVar6._8_8_ & 0xffffffff) == 0xfa94a488 || NAN(pVar6.multiplier_)) goto LAB_00158249;
  }
  else {
LAB_00158249:
    std::__cxx11::string::_M_assign((string *)&ustring);
    while (uVar4 != 0xffffffffffffffff) {
      if (uVar4 == ustring._M_string_length - 1) {
        std::__cxx11::string::erase((ulong)&ustring,uVar4);
      }
      else {
        cVar1 = ustring._M_dataplus._M_p[uVar4 + 1];
        if ((byte)(cVar1 - 0x30U) < 10) {
          if ((uVar4 != 0) && (ustring._M_dataplus._M_p[uVar4 - 1] != '^')) {
            std::__cxx11::string::insert((ulong)&ustring,uVar4,'\x01');
          }
        }
        else {
          if (cVar1 == mchar) goto LAB_0015835d;
          if ((cVar1 != '(') && (cVar1 != '[')) {
            ustring._M_dataplus._M_p[uVar4] = '*';
          }
        }
      }
      uVar4 = std::__cxx11::string::find((char)&ustring,(ulong)(uint)(int)mchar);
    }
    bVar3 = std::operator!=(&ustring,unit_string);
    if (!bVar3) {
LAB_0015835d:
      pVar2.base_units_ = (unit_data)0xfa94a488;
      pVar2.commodity_ = 0;
      pVar2.multiplier_ = NAN;
      goto LAB_00158363;
    }
    std::__cxx11::string::string((string *)&local_70,(string *)&ustring);
    pVar2.base_units_ = (unit_data)0xfa94a488;
    pVar2.commodity_ = 0;
    pVar2.multiplier_ = NAN;
    pVar6 = unit_from_string_internal(&local_70,match_flags | 0x400000000);
    std::__cxx11::string::~string((string *)&local_70);
    if ((pVar6._8_8_ & 0xffffffff) == 0xfa94a488 || NAN(pVar6.multiplier_)) goto LAB_00158363;
  }
  pVar2 = pVar6;
LAB_00158363:
  std::__cxx11::string::~string((string *)&ustring);
  return pVar2;
}

Assistant:

static precise_unit checkMultiplierCharacter(
    const std::string& unit_string,
    std::uint64_t match_flags,
    char mchar)
{
    // assume mchar means multiply
    std::string ustring;
    precise_unit retunit;
    auto fd = unit_string.find_first_of(mchar);
    if (fd != std::string::npos) {
        // if there is a single one just check for a merged unit
        if (unit_string.find_first_of(mchar, fd + 1) == std::string::npos) {
            ustring = unit_string;
            ustring.erase(fd, 1);
            retunit = unit_quick_match(ustring, match_flags);
            if (!is_error(retunit)) {
                return retunit;
            }
        }
        ustring = unit_string;
        while (fd != std::string::npos) {
            if (fd == ustring.size() - 1) {
                ustring.erase(fd, 1);
            } else if (isDigitCharacter(ustring[fd + 1])) {
                if (fd > 0 && ustring[fd - 1] != '^') {
                    ustring.insert(fd, 1, '^');
                    fd += 1;
                }
            } else if (ustring[fd + 1] == mchar) {
                // repeated characters,  cannot mean separator
                return precise::invalid;
            } else if (ustring[fd + 1] != '[' && ustring[fd + 1] != '(') {
                ustring[fd] = '*';
            }
            // ignore adjacent ones
            fd = ustring.find_first_of(mchar, fd + 2);
        }
        if (ustring != unit_string) {
            retunit = unit_from_string_internal(
                ustring, match_flags | skip_partition_check);
            if (!is_error(retunit)) {
                return retunit;
            }
        }
    }
    return precise::invalid;
}